

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_FonSetName(Cba_Ntk_t *p,int f,int x)

{
  int iVar1;
  char *__assertion;
  
  if ((p->vFonName).nSize < 1) {
    __assertion = "Cba_NtkHasFonNames(p)";
  }
  else if (f < 1) {
    __assertion = "Cba_FonIsReal(f)";
  }
  else {
    iVar1 = Cba_FonName(p,f);
    if (iVar1 == 0) {
      Vec_IntSetEntry(&p->vFonName,f,x);
      return;
    }
    __assertion = "Cba_FonName(p, f) == 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x11f,"void Cba_FonSetName(Cba_Ntk_t *, int, int)");
}

Assistant:

static inline void           Cba_FonSetName( Cba_Ntk_t * p, int f, int x )   { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); assert(Cba_FonName(p, f) == 0); Vec_IntSetEntry(&p->vFonName, f, x); }